

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

aiMeshMorphAnim * CreateMeshMorphAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  uint uVar2;
  Sampler *pSVar3;
  ulong uVar4;
  float *pfVar5;
  aiMeshMorphAnim *paVar6;
  ulong *puVar7;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  aiMeshMorphKey *paVar14;
  long lVar15;
  float *values;
  float *times;
  float *local_68;
  ulong local_60;
  ulong local_58;
  float *local_50;
  ulong local_48;
  long local_40 [2];
  
  paVar6 = (aiMeshMorphAnim *)operator_new(0x410);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mNumKeys = 0;
  paVar6->mKeys = (aiMeshMorphKey *)0x0;
  uVar4 = (ulong)((node->super_Object).name._M_string_length != 0);
  lVar11 = *(long *)((node->matrix).value + uVar4 * 8 + -0x1c);
  local_50 = (float *)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar11,*(long *)((node->matrix).value + uVar4 * 8 + -0x1a) + lVar11
            );
  pfVar5 = local_50;
  if (local_48 < 0x400) {
    (paVar6->mName).length = (ai_uint32)local_48;
    memcpy((paVar6->mName).data,local_50,local_48);
    (paVar6->mName).data[local_48] = '\0';
  }
  if (pfVar5 != (float *)local_40) {
    operator_delete(pfVar5,local_40[0] + 1);
  }
  pSVar3 = samplers->weight;
  if (pSVar3 != (Sampler *)0x0) {
    lVar11 = 0;
    local_50 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar3->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar3->input).index],&local_50);
    local_68 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((samplers->weight->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->weight->output).index],&local_68);
    pSVar3 = samplers->weight;
    uVar4 = (((pSVar3->input).vector)->
            super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(pSVar3->input).index]->count;
    uVar9 = (uint)uVar4;
    paVar6->mNumKeys = uVar9;
    uVar2 = (uint)(((pSVar3->output).vector)->
                  super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[(pSVar3->output).index]->count;
    lVar15 = (uVar4 & 0xffffffff) * 0x20;
    puVar7 = (ulong *)operator_new__(lVar15 + 8);
    *puVar7 = uVar4 & 0xffffffff;
    paVar14 = (aiMeshMorphKey *)(puVar7 + 1);
    do {
      puVar1 = (undefined8 *)((long)puVar7 + lVar11 + 0x14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&paVar14->mTime + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar11 = lVar11 + 0x20;
    } while (lVar15 != lVar11);
    uVar13 = 0;
    uVar4 = (ulong)uVar2 / (uVar4 & 0xffffffff);
    paVar6->mKeys = paVar14;
    local_58 = uVar4 * 4;
    local_60 = uVar4 * 8;
    iVar12 = 0;
    do {
      paVar14[uVar13].mTime = (double)(local_50[uVar13] * 1000.0);
      *(int *)(puVar7 + uVar13 * 4 + 4) = (int)uVar4;
      pvVar8 = operator_new__(local_58);
      puVar7[uVar13 * 4 + 2] = (ulong)pvVar8;
      pvVar8 = operator_new__(local_60);
      puVar7[uVar13 * 4 + 3] = (ulong)pvVar8;
      if (uVar9 <= uVar2) {
        uVar10 = 0;
        do {
          paVar14[uVar13].mValues[uVar10] = (uint)uVar10;
          paVar14[uVar13].mWeights[uVar10] =
               (double)(float)(~-(uint)(local_68[iVar12 + (uint)uVar10] <= 0.0) &
                              (uint)local_68[iVar12 + (uint)uVar10]);
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar4);
        iVar12 = iVar12 + (int)uVar10;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar9 + (uVar9 == 0));
    if (local_50 != (float *)0x0) {
      operator_delete__(local_50);
    }
    if (local_68 != (float *)0x0) {
      operator_delete__(local_68);
    }
  }
  return paVar6;
}

Assistant:

aiMeshMorphAnim *CreateMeshMorphAnim(glTF2::Asset &r, Node &node, AnimationSamplers &samplers) {
	aiMeshMorphAnim *anim = new aiMeshMorphAnim();
	anim->mName = GetNodeName(node);

	static const float kMillisecondsFromSeconds = 1000.f;

	if (nullptr != samplers.weight) {
		float *times = nullptr;
		samplers.weight->input->ExtractData(times);
		float *values = nullptr;
		samplers.weight->output->ExtractData(values);
		anim->mNumKeys = static_cast<uint32_t>(samplers.weight->input->count);

		const unsigned int numMorphs = (unsigned int)samplers.weight->output->count / anim->mNumKeys;

		anim->mKeys = new aiMeshMorphKey[anim->mNumKeys];
		unsigned int k = 0u;
		for (unsigned int i = 0u; i < anim->mNumKeys; ++i) {
			anim->mKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
			anim->mKeys[i].mNumValuesAndWeights = numMorphs;
			anim->mKeys[i].mValues = new unsigned int[numMorphs];
			anim->mKeys[i].mWeights = new double[numMorphs];

			for (unsigned int j = 0u; j < numMorphs; ++j, ++k) {
				anim->mKeys[i].mValues[j] = j;
				anim->mKeys[i].mWeights[j] = (0.f > values[k]) ? 0.f : values[k];
			}
		}

		delete[] times;
		delete[] values;
	}

	return anim;
}